

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbutton.cpp
# Opt level: O1

void QToolButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ArrowType *pAVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_40 = *_a[1];
      puStack_30 = &local_40;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
      break;
    case 1:
      showMenu((QToolButton *)_o);
      break;
    case 2:
      setToolButtonStyle((QToolButton *)_o,*_a[1]);
      break;
    case 3:
      setDefaultAction((QToolButton *)_o,*_a[1]);
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_004c4032_caseD_1;
    case WriteProperty:
      break;
    default:
      goto switchD_004c4032_caseD_3;
    case IndexOfMethod:
      goto switchD_004c4032_caseD_5;
    case RegisterMethodArgumentMetaType:
      goto switchD_004c4032_caseD_7;
    }
  case ReadProperty:
switchD_004c4032_caseD_1:
    if ((uint)_id < 4) {
      switch(_id) {
      case 0:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e8);
        break;
      case 1:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e4);
        break;
      case 2:
        *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0x2ec) >> 3 & 1;
        goto LAB_004c419d;
      case 3:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e0);
      }
      *(undefined4 *)*_a = uVar3;
    }
LAB_004c419d:
    if (_c != WriteProperty) goto switchD_004c4032_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_004c4032_caseD_3;
  case IndexOfMethod:
switchD_004c4032_caseD_5:
    if ((*_a[1] == triggered) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004c4032_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_004c4032_caseD_3;
      goto switchD_004c4032_caseD_1;
    }
    break;
  case RegisterMethodArgumentMetaType:
switchD_004c4032_caseD_7:
    if ((_id == 0) || (_id == 3)) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_004c40f4;
      *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
    }
    else {
      puVar2 = (undefined8 *)*_a;
LAB_004c40f4:
      *puVar2 = 0;
    }
    if (_c == ReadProperty) goto switchD_004c4032_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004c4032_caseD_3;
      goto switchD_004c4032_caseD_5;
    }
  }
  if ((uint)_id < 4) {
    pAVar1 = (ArrowType *)*_a;
    switch(_id) {
    case 0:
      *(ArrowType *)(*(long *)(_o + 8) + 0x2e8) = *pAVar1;
      break;
    case 1:
      setToolButtonStyle((QToolButton *)_o,*pAVar1);
      break;
    case 2:
      *(byte *)(*(long *)(_o + 8) + 0x2ec) =
           *(byte *)(*(long *)(_o + 8) + 0x2ec) & 0xf7 | (char)*pAVar1 << 3;
      QWidget::update((QWidget *)_o);
      break;
    case 3:
      setArrowType((QToolButton *)_o,*pAVar1);
    }
  }
switchD_004c4032_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 1: _t->showMenu(); break;
        case 2: _t->setToolButtonStyle((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 3: _t->setDefaultAction((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolButton::*)(QAction * )>(_a, &QToolButton::triggered, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<ToolButtonPopupMode*>(_v) = _t->popupMode(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->autoRaise(); break;
        case 3: *reinterpret_cast<Qt::ArrowType*>(_v) = _t->arrowType(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPopupMode(*reinterpret_cast<ToolButtonPopupMode*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAutoRaise(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setArrowType(*reinterpret_cast<Qt::ArrowType*>(_v)); break;
        default: break;
        }
    }
}